

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  char *pcVar1;
  int iVar2;
  LogDestination *this;
  CheckOpString _result;
  MutexLock l;
  MutexLock local_50;
  MutexLock local_48;
  undefined4 local_40;
  LogSeverity local_3c;
  LogMessageFatal local_38;
  
  local_48.mu_ = local_48.mu_ & 0xffffffff00000000;
  local_38.super_LogMessage.allocated_._0_4_ = severity;
  if (severity < 0) {
    local_50.mu_ = (Mutex *)MakeCheckOpString<int,int>
                                      ((int *)&local_38,(int *)&local_48,"severity >= 0");
    if (local_50.mu_ != (Mutex *)0x0) {
      LogMessageFatal::LogMessageFatal
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging.cc"
                 ,0x26a,(CheckOpString *)&local_50);
      LogMessageFatal::~LogMessageFatal(&local_38);
    }
  }
  else {
    local_40 = 4;
    local_3c = severity;
    if (3 < (uint)severity) {
      SetLogSymlink();
    }
  }
  local_48.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar2 != 0) goto LAB_0012e2b0;
  }
  this = (LogDestination *)(&log_destinations_)[severity];
  if (this == (LogDestination *)0x0) {
    this = (LogDestination *)operator_new(0xe0);
    LogDestination(this,severity,(char *)0x0);
    (&log_destinations_)[severity] = this;
  }
  local_50.mu_ = &(this->fileobject_).lock_;
  if ((this->fileobject_).lock_.is_safe_ == true) {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_50.mu_);
    if (iVar2 != 0) {
LAB_0012e2b0:
      abort();
    }
  }
  pcVar1 = (char *)(this->fileobject_).symlink_basename_._M_string_length;
  strlen(symlink_basename);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->fileobject_).symlink_basename_,0,pcVar1,(ulong)symlink_basename);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_50);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_48);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}